

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack28_24(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  uVar1 = *in;
  auVar8 = *(undefined1 (*) [16])(in + 1);
  auVar12 = vpmovsxbd_avx(ZEXT416(0x2010004));
  auVar15._8_8_ = 0x80000000c;
  auVar15._0_8_ = 0x80000000c;
  auVar13._8_8_ = 0x1800000014;
  auVar13._0_8_ = 0x1800000014;
  auVar14._8_8_ = 0xf0000000ff00000;
  auVar14._0_8_ = 0xf0000000ff00000;
  uVar3 = *(ulong *)(in + 0xc);
  uVar2 = in[7];
  *out = uVar1 & 0xfffffff;
  uVar4 = *(ulong *)(in + 5);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar4;
  auVar7 = vpalignr_avx(auVar10,auVar8,0xc);
  auVar6 = vpermt2d_avx512vl(auVar8,auVar12,ZEXT416(uVar1));
  auVar5 = vpmovsxbd_avx(ZEXT416(0x100c0804));
  auVar10 = vpsllvd_avx2(auVar10,auVar13);
  auVar7 = vpsrlvd_avx2(auVar7,auVar15);
  auVar7 = vpternlogd_avx512vl(auVar10,auVar7,auVar14,0xec);
  auVar8 = vpshldvd_avx512_vbmi2(auVar8,auVar6,auVar5);
  auVar11._8_4_ = 0xfffffff;
  auVar11._0_8_ = 0xfffffff0fffffff;
  auVar11._12_4_ = 0xfffffff;
  auVar8 = vpand_avx(auVar8,auVar11);
  *(undefined1 (*) [16])(out + 1) = auVar8;
  *(long *)(out + 5) = auVar7._0_8_;
  auVar8 = *(undefined1 (*) [16])(in + 8);
  out[7] = (uint)(uVar4 >> 0x24);
  uVar1 = in[0xe];
  out[8] = uVar2 & 0xfffffff;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar3;
  auVar10 = vpalignr_avx(auVar7,auVar8,0xc);
  auVar9 = vpermt2d_avx512vl(auVar8,auVar12,ZEXT416(uVar2));
  auVar6 = vpsllvd_avx2(auVar7,auVar13);
  auVar7 = *(undefined1 (*) [16])(in + 0xf);
  auVar8 = vpshldvd_avx512_vbmi2(auVar8,auVar9,auVar5);
  auVar8 = vpand_avx(auVar8,auVar11);
  auVar10 = vpsrlvd_avx2(auVar10,auVar15);
  auVar10 = vpternlogd_avx512vl(auVar6,auVar10,auVar14,0xec);
  *(undefined1 (*) [16])(out + 9) = auVar8;
  *(long *)(out + 0xd) = auVar10._0_8_;
  out[0xf] = (uint)(uVar3 >> 0x24);
  out[0x10] = uVar1 & 0xfffffff;
  uVar3 = *(ulong *)(in + 0x13);
  auVar10 = vpermi2d_avx512vl(auVar12,auVar7,ZEXT416(uVar1));
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar3;
  auVar8 = vpalignr_avx(auVar12,auVar7,0xc);
  auVar7 = vpshldvd_avx512_vbmi2(auVar7,auVar10,auVar5);
  auVar10 = vpsllvd_avx2(auVar12,auVar13);
  auVar7 = vpand_avx(auVar7,auVar11);
  auVar8 = vpsrlvd_avx2(auVar8,auVar15);
  *(undefined1 (*) [16])(out + 0x11) = auVar7;
  auVar8 = vpternlogd_avx512vl(auVar10,auVar8,auVar14,0xec);
  *(long *)(out + 0x15) = auVar8._0_8_;
  out[0x17] = (uint)(uVar3 >> 0x24);
  return in + 0x15;
}

Assistant:

const uint32_t *__fastunpack28_24(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 24)) << (28 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 20)) << (28 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 16)) << (28 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 12)) << (28 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 8)) << (28 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 4)) << (28 - 4);
  out++;
  *out = ((*in) >> 4);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 24)) << (28 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 20)) << (28 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 16)) << (28 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 12)) << (28 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 8)) << (28 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 4)) << (28 - 4);
  out++;
  *out = ((*in) >> 4);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 24)) << (28 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 20)) << (28 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 16)) << (28 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 12)) << (28 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 8)) << (28 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 4)) << (28 - 4);
  out++;
  *out = ((*in) >> 4);
  ++in;
  out++;

  return in;
}